

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O3

Up __thiscall yactfr::internal::TsdlParser::_tryParseNtStrType(TsdlParser *this)

{
  char *pcVar1;
  TextLocation loc;
  TextLocation loc_00;
  pointer pTVar2;
  bool bVar3;
  int iVar4;
  tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_> this_00;
  MapItem *this_01;
  PseudoScalarDtWrapper *pPVar5;
  TsdlParser *in_RSI;
  TsdlAttr *attr;
  TsdlAttr *this_02;
  _tAttrs attrs;
  TextLocation beginLoc;
  vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_> local_108;
  _Head_base<0UL,_yactfr::internal::PseudoDt_*,_false> local_f0;
  TextLocation local_e8;
  TsdlAttr local_d0;
  
  StrScanner::skipCommentsAndWhitespaces<true,true>(&in_RSI->_ss);
  pcVar1 = (in_RSI->_ss)._at;
  TextLocation::TextLocation
            (&local_e8,(long)pcVar1 - (long)(in_RSI->_ss)._begin,(in_RSI->_ss)._nbLines,
             (long)pcVar1 - (long)(in_RSI->_ss)._lineBegin);
  bVar3 = StrScanner::tryScanToken<true,true>(&in_RSI->_ss,"string");
  if (bVar3) {
    bVar3 = StrScanner::tryScanToken<true,true>(&in_RSI->_ss,"{");
    if (bVar3) {
      local_108.
      super__Vector_base<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>.
      _M_impl.super__Vector_impl_data._M_start = (TsdlAttr *)0x0;
      local_108.
      super__Vector_base<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>.
      _M_impl.super__Vector_impl_data._M_finish = (TsdlAttr *)0x0;
      local_108.
      super__Vector_base<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f0._M_head_impl = (PseudoDt *)this;
      while( true ) {
        do {
          StrScanner::skipCommentsAndWhitespaces<true,true>(&in_RSI->_ss);
          bVar3 = StrScanner::tryScanToken<true,true>(&in_RSI->_ss,";");
        } while (bVar3);
        bVar3 = StrScanner::tryScanToken<true,true>(&in_RSI->_ss,"}");
        if (bVar3) break;
        _expectAttr(&local_d0,in_RSI);
        std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>::
        emplace_back<yactfr::internal::TsdlAttr>(&local_108,&local_d0);
        if (local_d0.valLoc.super_type.m_initialized == true) {
          local_d0.valLoc.super_type.m_initialized = false;
        }
        if (local_d0.nameLoc.super_type.m_initialized == true) {
          local_d0.nameLoc.super_type.m_initialized = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.strVal._M_dataplus._M_p != &local_d0.strVal.field_2) {
          operator_delete(local_d0.strVal._M_dataplus._M_p,
                          local_d0.strVal.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.name._M_dataplus._M_p != &local_d0.name.field_2) {
          operator_delete(local_d0.name._M_dataplus._M_p,
                          local_d0.name.field_2._M_allocated_capacity + 1);
        }
      }
      _checkDupAttr(&local_108);
      pTVar2 = local_108.
               super__Vector_base<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_02 = local_108.
                     super__Vector_base<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_02 != pTVar2;
          this_02 = this_02 + 1) {
        iVar4 = std::__cxx11::string::compare((char *)&this_02->name);
        if (iVar4 == 0) {
          TsdlAttr::hasEncoding(this_02);
        }
        else {
          TsdlAttr::throwUnknown(this_02);
        }
      }
      this_01 = (MapItem *)operator_new(0x20);
      local_d0._0_8_ =
           (__uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>)0x0;
      NullTerminatedStringType::NullTerminatedStringType
                ((NullTerminatedStringType *)this_01,8,Utf8,(Up *)&local_d0);
      this = (TsdlParser *)local_f0;
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  &local_d0);
      pPVar5 = (PseudoScalarDtWrapper *)operator_new(0x40);
      loc_00._lineNumber = local_e8._lineNumber;
      loc_00._offset = local_e8._offset;
      loc_00._colNumber = local_e8._colNumber;
      local_d0._0_8_ = this_01;
      PseudoScalarDtWrapper::PseudoScalarDtWrapper(pPVar5,(Up *)&local_d0,loc_00);
      if ((MapItem *)local_d0._0_8_ != (MapItem *)0x0) {
        (*(((StringType *)local_d0._0_8_)->super_ScalarDataType).super_DataType._vptr_DataType[1])()
        ;
      }
      *(PseudoScalarDtWrapper **)this = pPVar5;
      std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>::~vector
                (&local_108);
    }
    else {
      this_00.
      super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
      super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
           operator_new(0x20);
      local_d0._0_8_ =
           (__uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>)0x0;
      NullTerminatedStringType::NullTerminatedStringType
                ((NullTerminatedStringType *)
                 this_00.
                 super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>
                 .super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl,8,Utf8,
                 (Up *)&local_d0);
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  &local_d0);
      pPVar5 = (PseudoScalarDtWrapper *)operator_new(0x40);
      loc._lineNumber = local_e8._lineNumber;
      loc._offset = local_e8._offset;
      loc._colNumber = local_e8._colNumber;
      local_d0._0_8_ =
           this_00.
           super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>
           .super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
      PseudoScalarDtWrapper::PseudoScalarDtWrapper(pPVar5,(Up *)&local_d0,loc);
      if ((_Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
          local_d0._0_8_ != (MapItem *)0x0) {
        (**(code **)(*(long *)local_d0._0_8_ + 8))();
      }
      (this->_ss)._begin = (char *)pPVar5;
    }
  }
  else {
    (this->_ss)._begin = (char *)0x0;
  }
  return (__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
          )(tuple<yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>)
           this;
}

Assistant:

PseudoDt::Up TsdlParser::_tryParseNtStrType()
{
    _ss.skipCommentsAndWhitespaces();

    const auto beginLoc = _ss.loc();

    // parse `string`
    if (!_ss.tryScanToken("string")) {
        return nullptr;
    }

    // try to parse `{`
    if (!_ss.tryScanToken("{")) {
        return std::make_unique<PseudoScalarDtWrapper>(std::make_unique<const NullTerminatedStringType>(8),
                                                       beginLoc);
    }

    // parse attributes
    _tAttrs attrs;

    while (true) {
        this->_skipCommentsAndWhitespacesAndSemicolons();

        // end of block?
        if (_ss.tryScanToken("}")) {
            break;
        }

        // parse attribute
        attrs.push_back(this->_expectAttr());
    }

    // check for duplicate attributes
    TsdlParser::_checkDupAttr(attrs);

    // check attributes
    for (const auto& attr : attrs) {
        if (attr.name == "encoding") {
            // only used to validate
            attr.hasEncoding();
        } else {
            attr.throwUnknown();
        }
    }

    return std::make_unique<PseudoScalarDtWrapper>(std::make_unique<const NullTerminatedStringType>(8),
                                                   beginLoc);
}